

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O0

BinaryInstr<(flow::BinaryOperator)16,_(flow::LiteralType)1> * __thiscall
flow::IRBuilder::
insert<flow::BinaryInstr<(flow::BinaryOperator)16,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
          (IRBuilder *this,Value **args,Value **args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  BinaryInstr<(flow::BinaryOperator)16,_(flow::LiteralType)1> *pBVar1;
  unique_ptr<flow::BinaryInstr<(flow::BinaryOperator)16,_(flow::LiteralType)1>,_std::default_delete<flow::BinaryInstr<(flow::BinaryOperator)16,_(flow::LiteralType)1>_>_>
  local_38;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  Value **args_local_1;
  Value **args_local;
  IRBuilder *this_local;
  
  local_28 = args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = args;
  args_local = (Value **)this;
  std::
  make_unique<flow::BinaryInstr<(flow::BinaryOperator)16,(flow::LiteralType)1>,flow::Value*,flow::Value*,std::__cxx11::string>
            ((Value **)&local_38,args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::BinaryInstr<(flow::BinaryOperator)16,(flow::LiteralType)1>,std::default_delete<flow::BinaryInstr<(flow::BinaryOperator)16,(flow::LiteralType)1>>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)&local_30,&local_38);
  pBVar1 = (BinaryInstr<(flow::BinaryOperator)16,_(flow::LiteralType)1> *)insert(this,&local_30);
  std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr(&local_30);
  std::
  unique_ptr<flow::BinaryInstr<(flow::BinaryOperator)16,_(flow::LiteralType)1>,_std::default_delete<flow::BinaryInstr<(flow::BinaryOperator)16,_(flow::LiteralType)1>_>_>
  ::~unique_ptr(&local_38);
  return pBVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }